

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

bool doctest::detail::parseOption(int argc,char **argv,char *pattern,String *res,String *defaultVal)

{
  bool bVar1;
  
  String::operator=(res,defaultVal);
  bVar1 = parseOptionImpl(argc,argv,pattern,res);
  if (bVar1) {
    return true;
  }
  bVar1 = parseOptionImpl(argc,argv,pattern + 3,res);
  return bVar1;
}

Assistant:

bool parseOption(int argc, const char* const* argv, const char* pattern, String& res,
                     const String& defaultVal = String()) {
        res = defaultVal;
#ifndef DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
        if(!parseOptionImpl(argc, argv, pattern, res))
            return parseOptionImpl(argc, argv, pattern + 3, res); // 3 for "dt-"
        return true;
#else // DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
        return parseOptionImpl(argc, argv, pattern, res);
#endif // DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
    }